

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void huangzhong(dw_rom *rom)

{
  doae(rom);
  vpatch(rom,0x1a8b,5,0x30,0x27,3,0x27,0x35);
  vpatch(rom,0x12260,0x40,0xe0,0xe0,0xc0,0,0xf0,0xa0,0x80,0xb0,0,0xc0,0xf0,0xf0,0x40,0xf0,0x70,0x40,
         0xf0,0x70,0x30,0x30,0x8c,0xf0,0xf0,0,0x10,0x80,0xcc,0xfc,0xfc,0xe0,0xf0,0xe0,0xe0,0xe0,0xc0
         ,0,0xf0,0xa0,0x80,0xb8,0,0xc0,0xf0,0xf0,0x40,0xf0,0x70,0x4e,0xf8,0xfe,0xf0,0x30,0xc0,0xf0,
         0xf0,0x40,0x9e,0x8e,0xc0,0xf0,0xf0,0xe0,0xfc,0x78);
  vpatch(rom,0x12300,0x80,7,0xf,0xc,1,0xe,10,0x7a,0xfb,6,0xe,0x1f,0x1f,0x11,0x17,0x17,4,0x3f,0x3f,
         0x1f,7,0x18,0xf,0xf,1,0xc9,0xf8,0x1c,0xe,0xf,1,0xf,0x1f,7,0xf,0xc,1,0xe,10,0x1a,0x1b,6,0xe,
         0x1f,0x1f,0x11,0x17,0x17,0x14,0x3f,0x7f,0x7f,0x17,0x18,0x1f,3,0,9,8,0x7c,0x7e,0x6f,0x11,0xf
         ,0,0xe0);
  vpatch(rom,0x12400,0x180,0x67,0xcf,0xcc,0xc1,0xce,0x4a,0x7a,0xfb,6,0xe,0x1f,0x1f,0x11,0x17,0x57,4,
         0x3f,0x3f,0x5f,0x47,0x58,0xf,0xf,1,0xc9,0xf8,0x5c,0x4e,0x4f,1,0xf,0x1f,0xe0,0xf0,0x30,0x80,
         0x70,0x50,0x58,0xde,0x60,0x70,0xf8,0xf8,0x88,0xe8,0xe8,0x28,0xff,0xff,0xff,0xe0,0x18,0xf8,
         0xc0,0,0x90,0x13,0x3f,0x73,0xf3,0x88,0xf0,0,7);
  vpatch(rom,0x12a20,0x70,0xff,0xff,0xff,0x7f,0x1f,0x1f,0xf,0,0xe7,0x60,0x24,2,1,0,0xf,0xe,0xff,0xff
         ,0xff,0xfe,0xfc,0xfc,0x80,0,0xe0,7,0x17,0x16,0x20,0,0xf0,0,7,0xf,0xf,0xf,0xf,0xf,0x77,0xf8,
         6,10,0x16,0x16,0x1e,0x1e,0x1f,0xf,0xe0,0xf6,0xf7,0xf1,0xf1,0xf5,0xef,0x1f,0x60,0x76,0x7f,
         0x7f,0x7f,0x7f,0xff,0xf1,0xff);
  vpatch(rom,0x12aa0,0x10,0xff,0xff,0xff,0xe0,0x9e,0xff,0x7e,4,4,0x7c,0xfe,0xff,0xff,0xfe,0xff,199);
  vpatch(rom,0x12ac0,0x10,0xe0,0xf6,0xf7,0xf1,0xf1,0xf7,0xef,0x1f,0x60,0x76,0x7f,0x7f,0x7f,0x7f,0xf9
         ,0xf0);
  vpatch(rom,0x12ae0,0x10,0xff,0xfb,0xf9,0xfc,0xe4,0xff,0x3f,0,0,0x3c,0x3e,0x3f,0x3f,0x7f,0x3f,0x1f)
  ;
  vpatch(rom,0x12b50,0x10,0xfc,0xfe,0x86,0x30,0xce,0x4a,0x4b,0x7b,0xcc,0xce,0xff,0xff,0x31,0xfd,0xfd
         ,0x85);
  vpatch(rom,0x12b80,0x20,0xfc,0xfe,0x86,0x30,0xce,0x4a,0x4b,0x7b,0xcc,0xce,0xff,0xff,0x31,0xfd,0xfd
         ,0x85,0x3f,0x7f,0xf6,0xf0,0xf7,0xf5,0xc,0x7d,0,0x3e,0x7f,0x7f,0x7a,0x7f,0x7b,0x8a);
  vpatch(rom,0x12bd0,0x10,0x3f,0x7f,0xf6,0xf0,0xf7,0xf5,0xc,0x7d,0,0x3e,0x7f,0x7f,0x7a,0x7f,0x7b,
         0x8a);
  return;
}

Assistant:

static void huangzhong(dw_rom *rom)
{
    doae(rom);
    vpatch(rom, 0x01a8b,   5, 0x30, 0x27, 0x03, 0x27, 0x35);
    vpatch(rom, 0x12260,  64, 0xE0, 0xE0, 0xC0, 0x00, 0xF0, 0xA0, 0x80, 0xB0, 0x00, 0xC0, 0xF0, 0xF0, 0x40, 0xF0, 0x70, 0x40, 0xF0, 0x70, 0x30, 0x30, 0x8C, 0xF0, 0xF0, 0x00, 0x10, 0x80, 0xCC, 0xFC, 0xFC, 0xE0, 0xF0, 0xE0, 0xE0, 0xE0, 0xC0, 0x00, 0xF0, 0xA0, 0x80, 0xB8, 0x00, 0xC0, 0xF0, 0xF0, 0x40, 0xF0, 0x70, 0x4E, 0xF8, 0xFE, 0xF0, 0x30, 0xC0, 0xF0, 0xF0, 0x40, 0x9E, 0x8E, 0xC0, 0xF0, 0xF0, 0xE0, 0xFC, 0x78);
    vpatch(rom, 0x12300, 128, 0x07, 0x0F, 0x0C, 0x01, 0x0E, 0x0A, 0x7A, 0xFB, 0x06, 0x0E, 0x1F, 0x1F, 0x11, 0x17, 0x17, 0x04, 0x3F, 0x3F, 0x1F, 0x07, 0x18, 0x0F, 0x0F, 0x01, 0xC9, 0xF8, 0x1C, 0x0E, 0x0F, 0x01, 0x0F, 0x1F, 0x07, 0x0F, 0x0C, 0x01, 0x0E, 0x0A, 0x1A, 0x1B, 0x06, 0x0E, 0x1F, 0x1F, 0x11, 0x17, 0x17, 0x14, 0x3F, 0x7F, 0x7F, 0x17, 0x18, 0x1F, 0x03, 0x00, 0x09, 0x08, 0x7C, 0x7E, 0x6F, 0x11, 0x0F, 0x00, 0xE0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xE8, 0x1E, 0x60, 0x70, 0x78, 0x78, 0x78, 0x78, 0xF8, 0xF0, 0xFF, 0xFE, 0xFC, 0xFC, 0xFC, 0xFC, 0x80, 0x00, 0xE0, 0x06, 0x14, 0x14, 0x20, 0x00, 0xF0, 0x00, 0xE0, 0xF0, 0xF0, 0xF0, 0xF0, 0xF0, 0xEE, 0x1F, 0x60, 0x70, 0x78, 0x78, 0x78, 0x78, 0xF8, 0xF0, 0xFF, 0xFE, 0xF8, 0xF8, 0xF8, 0xF8, 0xF0, 0x00, 0xE7, 0x06, 0x20, 0x40, 0x80, 0x00, 0xF0, 0x70);
    vpatch(rom, 0x12400, 384, 0x67, 0xCF, 0xCC, 0xC1, 0xCE, 0x4A, 0x7A, 0xFB, 0x06, 0x0E, 0x1F, 0x1F, 0x11, 0x17, 0x57, 0x04, 0x3F, 0x3F, 0x5F, 0x47, 0x58, 0x0F, 0x0F, 0x01, 0xC9, 0xF8, 0x5C, 0x4E, 0x4F, 0x01, 0x0F, 0x1F, 0xE0, 0xF0, 0x30, 0x80, 0x70, 0x50, 0x58, 0xDE, 0x60, 0x70, 0xF8, 0xF8, 0x88, 0xE8, 0xE8, 0x28, 0xFF, 0xFF, 0xFF, 0xE0, 0x18, 0xF8, 0xC0, 0x00, 0x90, 0x13, 0x3F, 0x73, 0xF3, 0x88, 0xF0, 0x00, 0x07, 0x0F, 0x0C, 0x01, 0x2E, 0x6A, 0x7A, 0x7B, 0x06, 0x0E, 0x1F, 0x1F, 0x11, 0x17, 0x17, 0x14, 0x7F, 0x3F, 0x7F, 0x17, 0x18, 0x3F, 0x23, 0x20, 0x09, 0x08, 0x7C, 0x7E, 0x6F, 0x31, 0x2F, 0x20, 0xE0, 0xF0, 0x30, 0x80, 0x70, 0x50, 0x5E, 0xDF, 0x60, 0x70, 0xF8, 0xF8, 0x88, 0xE8, 0xE8, 0x28, 0xFE, 0xF9, 0xF9, 0xE6, 0x18, 0xF0, 0xF0, 0x80, 0x96, 0x17, 0x3F, 0x76, 0xF0, 0x80, 0xF0, 0xF8, 0x07, 0x0F, 0x0F, 0x0F, 0x0F, 0x0F, 0x77, 0xF8, 0x06, 0x0A, 0x16, 0x16, 0x1E, 0x1E, 0x1F, 0x0F, 0xFF, 0x7F, 0x1F, 0x1F, 0x1F, 0x1F, 0x0F, 0x00, 0xE7, 0x60, 0x04, 0x02, 0x01, 0x00, 0x0F, 0x0E, 0xE0, 0xF0, 0xF4, 0xF6, 0xF6, 0xF6, 0xEE, 0x1E, 0x60, 0x70, 0x78, 0x78, 0x78, 0x78, 0xF8, 0xF0, 0xFF, 0xFE, 0xFF, 0xFE, 0xFC, 0xFC, 0x80, 0x00, 0xE0, 0x06, 0x17, 0x16, 0x20, 0x00, 0xF0, 0x00, 0x07, 0x0F, 0x0F, 0x0F, 0x0F, 0x0F, 0x17, 0x78, 0x06, 0x0A, 0x16, 0x16, 0x1E, 0x1E, 0x1F, 0x0F, 0xFF, 0x7F, 0xFF, 0xFF, 0x3F, 0x3F, 0x01, 0x00, 0x07, 0x60, 0xE8, 0xE8, 0x44, 0x00, 0x0F, 0x00, 0xE2, 0xF3, 0xF3, 0xF3, 0xF3, 0xF3, 0xEE, 0x1F, 0x60, 0x70, 0x78, 0x78, 0x78, 0x78, 0xF8, 0xF0, 0xFF, 0xFE, 0xFA, 0xFA, 0xFA, 0xF8, 0xF0, 0x00, 0xE7, 0x06, 0x22, 0x42, 0x82, 0x00, 0xF0, 0x70, 0x07, 0x0F, 0x1E, 0x1E, 0x1E, 0x1E, 0x01, 0x0F, 0x00, 0x07, 0x0F, 0x0F, 0x0F, 0x0F, 0x0F, 0x11, 0x1F, 0x1F, 0x1F, 0x3F, 0x3C, 0x3F, 0x07, 0x00, 0x00, 0x07, 0x07, 0x07, 0x07, 0x0F, 0x07, 0x03, 0xE0, 0xE0, 0xC0, 0x08, 0xFC, 0xAC, 0x8C, 0xB4, 0x00, 0xC0, 0xF0, 0xF0, 0x40, 0xF0, 0x70, 0x40, 0xF4, 0x74, 0x30, 0x30, 0x8C, 0xF4, 0xF4, 0x00, 0x10, 0x84, 0xCC, 0xFC, 0xFC, 0xE4, 0xF4, 0xE0, 0x07, 0x0F, 0x1E, 0x1E, 0x1E, 0x1E, 0x01, 0x0F, 0x00, 0x07, 0x0F, 0x0F, 0x0F, 0x0F, 0x0F, 0x11, 0x1F, 0x3F, 0x3F, 0xEC, 0x67, 0x3F, 0x07, 0x00, 0x00, 0x0F, 0x1F, 0x1F, 0x1F, 0x1F, 0x3F, 0x18, 0xE4, 0xE6, 0xC6, 0x06, 0xF2, 0xA2, 0x82, 0xB8, 0x00, 0xC0, 0xF0, 0xF0, 0x40, 0xF0, 0x72, 0x4E, 0xF8, 0xFE, 0xF2, 0x32, 0xC0, 0xF0, 0xF0, 0x40, 0x9E, 0x8E, 0xC2, 0xF2, 0xF0, 0xE0, 0xFC, 0x78);
    vpatch(rom, 0x12a20, 112, 0xFF, 0xFF, 0xFF, 0x7F, 0x1F, 0x1F, 0x0F, 0x00, 0xE7, 0x60, 0x24, 0x02, 0x01, 0x00, 0x0F, 0x0E, 0xFF, 0xFF, 0xFF, 0xFE, 0xFC, 0xFC, 0x80, 0x00, 0xE0, 0x07, 0x17, 0x16, 0x20, 0x00, 0xF0, 0x00, 0x07, 0x0F, 0x0F, 0x0F, 0x0F, 0x0F, 0x77, 0xF8, 0x06, 0x0A, 0x16, 0x16, 0x1E, 0x1E, 0x1F, 0x0F, 0xE0, 0xF6, 0xF7, 0xF1, 0xF1, 0xF5, 0xEF, 0x1F, 0x60, 0x76, 0x7F, 0x7F, 0x7F, 0x7F, 0xFF, 0xF1, 0xFF, 0xFF, 0xFF, 0xFF, 0x3F, 0x3F, 0x01, 0x00, 0x07, 0x60, 0xE8, 0xE8, 0x04, 0x00, 0x0F, 0x00, 0xFF, 0xFF, 0xFF, 0xFE, 0xF8, 0xF8, 0xF0, 0x00, 0xE7, 0x07, 0x27, 0x46, 0x80, 0x00, 0xF0, 0x70, 0x07, 0x0F, 0x0F, 0x0F, 0x0F, 0x0F, 0x17, 0x78, 0x06, 0x0A, 0x16, 0x16, 0x1E, 0x1E, 0x1F, 0x0F);
    vpatch(rom, 0x12aa0,  16, 0xFF, 0xFF, 0xFF, 0xE0, 0x9E, 0xFF, 0x7E, 0x04, 0x04, 0x7C, 0xFE, 0xFF, 0xFF, 0xFE, 0xFF, 0xC7);
    vpatch(rom, 0x12ac0,  16, 0xE0, 0xF6, 0xF7, 0xF1, 0xF1, 0xF7, 0xEF, 0x1F, 0x60, 0x76, 0x7F, 0x7F, 0x7F, 0x7F, 0xF9, 0xF0);
    vpatch(rom, 0x12ae0,  16, 0xFF, 0xFB, 0xF9, 0xFC, 0xE4, 0xFF, 0x3F, 0x00, 0x00, 0x3C, 0x3E, 0x3F, 0x3F, 0x7F, 0x3F, 0x1F);
    vpatch(rom, 0x12b50,  16, 0xFC, 0xFE, 0x86, 0x30, 0xCE, 0x4A, 0x4B, 0x7B, 0xCC, 0xCE, 0xFF, 0xFF, 0x31, 0xFD, 0xFD, 0x85);
    vpatch(rom, 0x12b80,  32, 0xFC, 0xFE, 0x86, 0x30, 0xCE, 0x4A, 0x4B, 0x7B, 0xCC, 0xCE, 0xFF, 0xFF, 0x31, 0xFD, 0xFD, 0x85, 0x3F, 0x7F, 0xF6, 0xF0, 0xF7, 0xF5, 0x0C, 0x7D, 0x00, 0x3E, 0x7F, 0x7F, 0x7A, 0x7F, 0x7B, 0x8A);
    vpatch(rom, 0x12bd0,  16,0x3F, 0x7F, 0xF6, 0xF0, 0xF7, 0xF5, 0x0C, 0x7D, 0x00, 0x3E, 0x7F, 0x7F, 0x7A, 0x7F, 0x7B, 0x8A);
}